

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[41],kj::String&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [41],String *params_2,char (*params_3) [3])

{
  char *pcVar1;
  ArrayPtr<const_char> local_60;
  undefined8 local_50;
  undefined8 uStack_48;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_50 = *(undefined8 *)this;
  uStack_48 = *(undefined8 *)(this + 8);
  local_60.size_ = strlen((char *)params);
  pcVar1 = *(char **)(*params_1 + 8);
  local_30.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_30.ptr = *(char **)*params_1;
  }
  local_30.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_30.size_ = (size_t)(pcVar1 + -1);
  }
  local_60.ptr = (char *)params;
  local_40.size_ = strlen((char *)params_2);
  local_40.ptr = (char *)params_2;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,&local_60,&local_30,&local_40,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}